

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meta_pipeline.cpp
# Opt level: O3

void __thiscall
duckdb::MetaPipeline::CreateChildPipeline
          (MetaPipeline *this,Pipeline *current,PhysicalOperator *op,Pipeline *last_pipeline)

{
  iterator __position;
  reference this_00;
  ClientContext *dependant;
  vector<std::reference_wrapper<duckdb::Pipeline>,std::allocator<std::reference_wrapper<duckdb::Pipeline>>>
  *this_01;
  reference_wrapper<duckdb::Pipeline> local_58;
  undefined1 local_50 [40];
  
  Executor::CreateChildPipeline
            ((Executor *)local_50,(Pipeline *)this->executor,(PhysicalOperator *)current);
  ::std::
  vector<duckdb::shared_ptr<duckdb::Pipeline,true>,std::allocator<duckdb::shared_ptr<duckdb::Pipeline,true>>>
  ::emplace_back<duckdb::shared_ptr<duckdb::Pipeline,true>>
            ((vector<duckdb::shared_ptr<duckdb::Pipeline,true>,std::allocator<duckdb::shared_ptr<duckdb::Pipeline,true>>>
              *)&this->pipelines,(shared_ptr<duckdb::Pipeline,_true> *)local_50);
  if ((PhysicalOperator *)local_50._8_8_ != (PhysicalOperator *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_);
  }
  this_00 = vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_true>::back(&this->pipelines);
  dependant = (ClientContext *)shared_ptr<duckdb::Pipeline,_true>::operator*(this_00);
  (dependant->config).profiler_settings._M_h._M_buckets = (__buckets_ptr)current->base_batch_index;
  local_50._0_8_ = dependant;
  this_01 = (vector<std::reference_wrapper<duckdb::Pipeline>,std::allocator<std::reference_wrapper<duckdb::Pipeline>>>
             *)::std::__detail::
               _Map_base<std::reference_wrapper<duckdb::Pipeline>,_std::pair<const_std::reference_wrapper<duckdb::Pipeline>,_duckdb::vector<std::reference_wrapper<duckdb::Pipeline>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Pipeline>,_duckdb::vector<std::reference_wrapper<duckdb::Pipeline>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::Pipeline>,_duckdb::ReferenceHashFunction<duckdb::Pipeline>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::reference_wrapper<duckdb::Pipeline>,_std::pair<const_std::reference_wrapper<duckdb::Pipeline>,_duckdb::vector<std::reference_wrapper<duckdb::Pipeline>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Pipeline>,_duckdb::vector<std::reference_wrapper<duckdb::Pipeline>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::Pipeline>,_duckdb::ReferenceHashFunction<duckdb::Pipeline>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&this->pipeline_dependencies,(key_type *)local_50);
  __position._M_current = *(reference_wrapper<duckdb::Pipeline> **)(this_01 + 8);
  local_58._M_data = current;
  if (__position._M_current == *(reference_wrapper<duckdb::Pipeline> **)(this_01 + 0x10)) {
    ::std::
    vector<std::reference_wrapper<duckdb::Pipeline>,std::allocator<std::reference_wrapper<duckdb::Pipeline>>>
    ::_M_realloc_insert<std::reference_wrapper<duckdb::Pipeline>>(this_01,__position,&local_58);
  }
  else {
    (__position._M_current)->_M_data = current;
    *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 8;
  }
  AddDependenciesFrom((vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_true> *)(local_50 + 0x10),
                      this,(Pipeline *)dependant,last_pipeline,false);
  ::std::
  vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
  ::~vector((vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
             *)(local_50 + 0x10));
  return;
}

Assistant:

void MetaPipeline::CreateChildPipeline(Pipeline &current, PhysicalOperator &op, Pipeline &last_pipeline) {
	// rule 2: 'current' must be fully built (down to the source) before creating the child pipeline
	D_ASSERT(current.source);

	// create the child pipeline (same batch index)
	pipelines.emplace_back(state.CreateChildPipeline(executor, current, op));
	auto &child_pipeline = *pipelines.back();
	child_pipeline.base_batch_index = current.base_batch_index;

	// child pipeline has a dependency (within this MetaPipeline on all pipelines that were scheduled
	// between 'current' and now (including 'current') - set them up
	pipeline_dependencies[child_pipeline].push_back(current);
	AddDependenciesFrom(child_pipeline, last_pipeline, false);
	D_ASSERT(pipeline_dependencies.find(child_pipeline) != pipeline_dependencies.end());
}